

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O0

void Dec_GraphPrint_rec(FILE *pFile,Dec_Graph_t *pGraph,Dec_Node_t *pNode,int fCompl,char **pNamesIn
                       ,int *pPos,int LitSizeMax)

{
  int iVar1;
  Dec_Node_t *pNode_00;
  Dec_Node_t *pNode_01;
  Dec_Node_t *pNode_02;
  Dec_Node_t *pNode_03;
  Dec_Node_t *pDVar2;
  Dec_Node_t *pDVar3;
  Dec_Node_t *pNode11;
  Dec_Node_t *pNode10;
  Dec_Node_t *pNode01;
  Dec_Node_t *pNode00;
  Dec_Node_t *pNode1;
  Dec_Node_t *pNode0;
  int *pPos_local;
  char **pNamesIn_local;
  int fCompl_local;
  Dec_Node_t *pNode_local;
  Dec_Graph_t *pGraph_local;
  FILE *pFile_local;
  
  pNode_00 = Dec_GraphNode(pGraph,(uint)pNode->eEdge0 >> 1 & 0x3fffffff);
  pNode_01 = Dec_GraphNode(pGraph,(uint)pNode->eEdge1 >> 1 & 0x3fffffff);
  iVar1 = Dec_GraphNodeIsVar(pGraph,pNode);
  if (iVar1 == 0) {
    iVar1 = Dec_GraphNodeIsVar(pGraph,pNode_00);
    if ((iVar1 == 0) && (iVar1 = Dec_GraphNodeIsVar(pGraph,pNode_01), iVar1 == 0)) {
      pNode_02 = Dec_GraphNode(pGraph,(uint)pNode_00->eEdge0 >> 1 & 0x3fffffff);
      pNode_03 = Dec_GraphNode(pGraph,(uint)pNode_00->eEdge1 >> 1 & 0x3fffffff);
      pDVar2 = Dec_GraphNode(pGraph,(uint)pNode_01->eEdge0 >> 1 & 0x3fffffff);
      pDVar3 = Dec_GraphNode(pGraph,(uint)pNode_01->eEdge1 >> 1 & 0x3fffffff);
      if (((pNode_02 == pDVar2) || (pNode_02 == pDVar3)) &&
         ((pNode_03 == pDVar2 || (pNode_03 == pDVar3)))) {
        fprintf((FILE *)pFile,"(");
        *pPos = *pPos + 1;
        Dec_GraphPrint_rec(pFile,pGraph,pNode_02,*(uint *)&pNode_02->field_0x10 >> 0xf & 1,pNamesIn,
                           pPos,LitSizeMax);
        fprintf((FILE *)pFile," # ");
        *pPos = *pPos + 3;
        Dec_GraphPrint_rec(pFile,pGraph,pNode_03,*(uint *)&pNode_03->field_0x10 >> 0x10 & 1,pNamesIn
                           ,pPos,LitSizeMax);
        fprintf((FILE *)pFile,")");
        *pPos = *pPos + 1;
        return;
      }
    }
    if (fCompl == 0) {
      fprintf((FILE *)pFile,"(");
      *pPos = *pPos + 1;
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,(uint)pNode->eEdge0 & 1,pNamesIn,pPos,LitSizeMax);
      Dec_GraphPrint_rec(pFile,pGraph,pNode_01,(uint)pNode->eEdge1 & 1,pNamesIn,pPos,LitSizeMax);
      fprintf((FILE *)pFile,")");
      *pPos = *pPos + 1;
    }
    else {
      fprintf((FILE *)pFile,"(");
      *pPos = *pPos + 1;
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,(uint)((((uint)pNode->eEdge0 & 1) != 0 ^ 0xffU) & 1),
                         pNamesIn,pPos,LitSizeMax);
      fprintf((FILE *)pFile," + ");
      *pPos = *pPos + 3;
      Dec_GraphPrint_rec(pFile,pGraph,pNode_01,(uint)((((uint)pNode->eEdge1 & 1) != 0 ^ 0xffU) & 1),
                         pNamesIn,pPos,LitSizeMax);
      fprintf((FILE *)pFile,")");
      *pPos = *pPos + 1;
    }
  }
  else {
    iVar1 = Dec_GraphNodeInt(pGraph,pNode);
    iVar1 = Dec_GraphPrintGetLeafName(pFile,iVar1,fCompl,pNamesIn);
    *pPos = iVar1 + *pPos;
  }
  return;
}

Assistant:

void Dec_GraphPrint_rec( FILE * pFile, Dec_Graph_t * pGraph, Dec_Node_t * pNode, int fCompl, char * pNamesIn[], int * pPos, int LitSizeMax )
{
    Dec_Node_t * pNode0, * pNode1;
    Dec_Node_t * pNode00, * pNode01, * pNode10, * pNode11;
    pNode0 = Dec_GraphNode(pGraph, pNode->eEdge0.Node);
    pNode1 = Dec_GraphNode(pGraph, pNode->eEdge1.Node);
    if ( Dec_GraphNodeIsVar(pGraph, pNode) ) // FT_NODE_LEAF )
    {
        (*pPos) += Dec_GraphPrintGetLeafName( pFile, Dec_GraphNodeInt(pGraph,pNode), fCompl, pNamesIn );
        return;
    }
    if ( !Dec_GraphNodeIsVar(pGraph, pNode0) && !Dec_GraphNodeIsVar(pGraph, pNode1) )
    {
        pNode00 = Dec_GraphNode(pGraph, pNode0->eEdge0.Node);
        pNode01 = Dec_GraphNode(pGraph, pNode0->eEdge1.Node);
        pNode10 = Dec_GraphNode(pGraph, pNode1->eEdge0.Node);
        pNode11 = Dec_GraphNode(pGraph, pNode1->eEdge1.Node);
        if ( (pNode00 == pNode10 || pNode00 == pNode11) && (pNode01 == pNode10 || pNode01 == pNode11) )
        {
            fprintf( pFile, "(" );
            (*pPos)++;
            Dec_GraphPrint_rec( pFile, pGraph, pNode00, pNode00->fCompl0, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, " # " );
            (*pPos) += 3;
            Dec_GraphPrint_rec( pFile, pGraph, pNode01, pNode01->fCompl1, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, ")" );
            (*pPos)++;
            return;
        }
    }
    if ( fCompl )
    {
        fprintf( pFile, "(" );
        (*pPos)++;
        Dec_GraphPrint_rec( pFile, pGraph, pNode0, !pNode->eEdge0.fCompl, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, " + " );
        (*pPos) += 3;
        Dec_GraphPrint_rec( pFile, pGraph, pNode1, !pNode->eEdge1.fCompl, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, ")" );
        (*pPos)++;
    }
    else
    {
        fprintf( pFile, "(" );
        (*pPos)++;
        Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->eEdge0.fCompl, pNamesIn, pPos, LitSizeMax );
        Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->eEdge1.fCompl, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, ")" );
        (*pPos)++;
    }
}